

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
          (EpsCopyInputStream *this,char *ptr,anon_class_32_4_91646d40 add)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  EpsCopyInputStream *end_00;
  EpsCopyInputStream *local_1d8;
  char *end;
  LogMessage local_160;
  RepeatedField<int> *local_128;
  FieldDescriptor *local_120;
  Reflection *local_118;
  Message *local_110;
  char *res;
  char *end_1;
  LogMessage local_f0;
  undefined8 local_b8;
  char buf [26];
  LogMessage local_88;
  int local_4c;
  RepeatedField<int> *pRStack_48;
  int overrun;
  FieldDescriptor *local_40;
  Reflection *local_38;
  Message *local_30;
  int local_28;
  uint32_t local_24;
  int chunk_size;
  int size;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  _chunk_size = ptr;
  ptr_local = (char *)this;
  local_24 = ReadSize((char **)&chunk_size);
  if (_chunk_size == (char *)0x0) {
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    local_28 = (int)this->buffer_end_ - (int)_chunk_size;
    while (local_28 < (int)local_24) {
      pRStack_48 = add.rep_enum;
      local_40 = add.field;
      local_38 = add.reflection;
      local_30 = add.msg;
      _chunk_size = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                              (_chunk_size,this->buffer_end_,add);
      if (_chunk_size == (char *)0x0) {
        return (char *)0x0;
      }
      local_4c = (int)_chunk_size - (int)this->buffer_end_;
      bVar1 = false;
      if ((local_4c < 0) || (0x10 < local_4c)) {
        LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                   ,0x2f2);
        bVar1 = true;
        pLVar2 = LogMessage::operator<<
                           (&local_88,"CHECK failed: overrun >= 0 && overrun <= kSlopBytes: ");
        LogFinisher::operator=((LogFinisher *)(buf + 0x13),pLVar2);
      }
      if (bVar1) {
        LogMessage::~LogMessage(&local_88);
      }
      if ((int)(local_24 - local_28) < 0x11) {
        memset(&local_b8,0,0x1a);
        local_b8 = *(undefined8 *)this->buffer_end_;
        buf._0_8_ = *(undefined8 *)(this->buffer_end_ + 8);
        end_1._7_1_ = 0;
        if (0x10 < (int)(local_24 - local_28)) {
          LogMessage::LogMessage
                    (&local_f0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                     ,0x2f9);
          end_1._7_1_ = 1;
          pLVar2 = LogMessage::operator<<
                             (&local_f0,"CHECK failed: (size - chunk_size) <= (kSlopBytes): ");
          LogFinisher::operator=((LogFinisher *)((long)&end_1 + 6),pLVar2);
        }
        if ((end_1._7_1_ & 1) != 0) {
          LogMessage::~LogMessage(&local_f0);
        }
        res = buf + (long)(int)(local_24 - local_28) + -8;
        local_128 = add.rep_enum;
        local_120 = add.field;
        local_118 = add.reflection;
        local_110 = add.msg;
        pcVar3 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           (buf + (long)local_4c + -8,res,add);
        if ((pcVar3 != (char *)0x0) && (pcVar3 == res)) {
          return this->buffer_end_ + ((long)pcVar3 - (long)&local_b8);
        }
        return (char *)0x0;
      }
      local_24 = local_24 - (local_4c + local_28);
      end._7_1_ = 0;
      if ((int)local_24 < 1) {
        LogMessage::LogMessage
                  (&local_160,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                   ,0x300);
        end._7_1_ = 1;
        pLVar2 = LogMessage::operator<<(&local_160,"CHECK failed: (size) > (0): ");
        LogFinisher::operator=((LogFinisher *)((long)&end + 6),pLVar2);
      }
      if ((end._7_1_ & 1) != 0) {
        LogMessage::~LogMessage(&local_160);
      }
      if (this->limit_ < 0x11) {
        return (char *)0x0;
      }
      _chunk_size = Next(this);
      if (_chunk_size == (char *)0x0) {
        return (char *)0x0;
      }
      _chunk_size = _chunk_size + local_4c;
      local_28 = (int)this->buffer_end_ - (int)_chunk_size;
    }
    end_00 = (EpsCopyInputStream *)(_chunk_size + (int)local_24);
    local_1d8 = (EpsCopyInputStream *)
                ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                          (_chunk_size,(char *)end_00,add);
    if (end_00 != local_1d8) {
      local_1d8 = (EpsCopyInputStream *)0x0;
    }
    this_local = local_1d8;
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedVarint(const char* ptr, Add add) {
  int size = ReadSize(&ptr);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int chunk_size = buffer_end_ - ptr;
  while (size > chunk_size) {
    ptr = ReadPackedVarintArray(ptr, buffer_end_, add);
    if (ptr == nullptr) return nullptr;
    int overrun = ptr - buffer_end_;
    GOOGLE_DCHECK(overrun >= 0 && overrun <= kSlopBytes);
    if (size - chunk_size <= kSlopBytes) {
      // The current buffer contains all the information needed, we don't need
      // to flip buffers. However we must parse from a buffer with enough space
      // so we are not prone to a buffer overflow.
      char buf[kSlopBytes + 10] = {};
      std::memcpy(buf, buffer_end_, kSlopBytes);
      GOOGLE_CHECK_LE(size - chunk_size, kSlopBytes);
      auto end = buf + (size - chunk_size);
      auto res = ReadPackedVarintArray(buf + overrun, end, add);
      if (res == nullptr || res != end) return nullptr;
      return buffer_end_ + (res - buf);
    }
    size -= overrun + chunk_size;
    GOOGLE_DCHECK_GT(size, 0);
    // We must flip buffers
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += overrun;
    chunk_size = buffer_end_ - ptr;
  }
  auto end = ptr + size;
  ptr = ReadPackedVarintArray(ptr, end, add);
  return end == ptr ? ptr : nullptr;
}